

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void aom_paeth_predictor_32x32_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [32];
  __m256i *in_RCX;
  __m256i *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m128i r1_1;
  __m128i r0_1;
  __m256i l16_1;
  __m128i r1;
  __m128i r0;
  __m256i l16;
  int i;
  __m256i one;
  __m256i rep;
  __m256i tl;
  __m256i t1;
  __m256i t0;
  __m256i l;
  undefined8 local_460;
  undefined8 uStackY_458;
  undefined8 local_450;
  undefined8 uStackY_448;
  __m256i *topleft;
  undefined1 in_stack_fffffffffffffbe0 [16];
  __m256i *top;
  __m256i *left_00;
  undefined1 local_410 [16];
  undefined8 uStack_408;
  int local_3c4;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  uint8_t local_360 [64];
  undefined1 local_320 [32];
  __m256i *local_300;
  __m256i *local_2f8;
  uint8_t *local_2f0;
  uint8_t *local_2e8;
  undefined1 local_2e0 [16];
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [16];
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined2 local_248;
  undefined2 local_246;
  undefined2 local_244;
  ushort local_242;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  uint8_t *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  uint8_t *local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  uint8_t *local_168;
  __m256i *local_160;
  undefined8 uStack_158;
  uint8_t *local_148;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  ushort local_120;
  ushort local_11e;
  ushort local_11c;
  ushort local_11a;
  ushort local_118;
  ushort local_116;
  ushort local_114;
  ushort local_112;
  ushort local_110;
  ushort local_10e;
  ushort local_10c;
  ushort local_10a;
  ushort local_108;
  ushort local_106;
  ushort local_104;
  ushort local_102;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined2 local_e0;
  undefined2 local_de;
  undefined2 local_dc;
  undefined2 local_da;
  undefined2 local_d8;
  undefined2 local_d6;
  undefined2 local_d4;
  undefined2 local_d2;
  undefined2 local_d0;
  undefined2 local_ce;
  undefined2 local_cc;
  undefined2 local_ca;
  undefined2 local_c8;
  undefined2 local_c6;
  undefined2 local_c4;
  undefined2 local_c2;
  undefined1 local_c0 [32];
  undefined2 local_a0;
  undefined2 local_9e;
  undefined2 local_9c;
  undefined2 local_9a;
  undefined2 local_98;
  undefined2 local_96;
  undefined2 local_94;
  undefined2 local_92;
  undefined2 local_90;
  undefined2 local_8e;
  undefined2 local_8c;
  undefined2 local_8a;
  undefined2 local_88;
  undefined2 local_86;
  undefined2 local_84;
  undefined2 local_82;
  undefined1 local_80 [32];
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined2 local_48;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  
  local_300 = in_RCX;
  local_2f8 = in_RDX;
  local_2f0 = in_RSI;
  local_2e8 = in_RDI;
  get_left_vector(in_RCX,in_RSI);
  local_320._8_8_ = in_XMM0_Qb;
  local_320._0_8_ = in_XMM0_Qa;
  local_320._16_8_ = in_YMM0_H;
  local_320._24_8_ = in_register_00001218;
  get_top_vector(local_2f8,in_RSI);
  get_top_vector((__m256i *)(*local_2f8 + 2),in_RSI);
  local_242 = (ushort)*(byte *)((long)local_2f8[-1] + 0x1f);
  auVar2 = vpinsrw_avx(ZEXT216(local_242),(uint)local_242,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)local_242,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)local_242,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)local_242,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)local_242,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)local_242,6);
  local_140 = vpinsrw_avx(auVar2,(uint)local_242,7);
  auVar2 = vpinsrw_avx(ZEXT216(local_242),(uint)local_242,1);
  auVar2 = vpinsrw_avx(auVar2,(uint)local_242,2);
  auVar2 = vpinsrw_avx(auVar2,(uint)local_242,3);
  auVar2 = vpinsrw_avx(auVar2,(uint)local_242,4);
  auVar2 = vpinsrw_avx(auVar2,(uint)local_242,5);
  auVar2 = vpinsrw_avx(auVar2,(uint)local_242,6);
  auStack_130 = vpinsrw_avx(auVar2,(uint)local_242,7);
  local_244 = 0x8000;
  local_c2 = 0x8000;
  local_c4 = 0x8000;
  local_c6 = 0x8000;
  local_c8 = 0x8000;
  local_ca = 0x8000;
  local_cc = 0x8000;
  local_ce = 0x8000;
  local_d0 = 0x8000;
  local_d2 = 0x8000;
  local_d4 = 0x8000;
  local_d6 = 0x8000;
  local_d8 = 0x8000;
  local_da = 0x8000;
  local_dc = 0x8000;
  local_de = 0x8000;
  local_e0 = 0x8000;
  auVar2 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
  auVar2 = vpinsrw_avx(auVar2,0x8000,2);
  auVar2 = vpinsrw_avx(auVar2,0x8000,3);
  auVar2 = vpinsrw_avx(auVar2,0x8000,4);
  auVar2 = vpinsrw_avx(auVar2,0x8000,5);
  auVar2 = vpinsrw_avx(auVar2,0x8000,6);
  local_100 = vpinsrw_avx(auVar2,0x8000,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
  auVar2 = vpinsrw_avx(auVar2,0x8000,2);
  auVar2 = vpinsrw_avx(auVar2,0x8000,3);
  auVar2 = vpinsrw_avx(auVar2,0x8000,4);
  auVar2 = vpinsrw_avx(auVar2,0x8000,5);
  auVar2 = vpinsrw_avx(auVar2,0x8000,6);
  auStack_f0 = vpinsrw_avx(auVar2,0x8000,7);
  local_3a0._16_8_ = auStack_f0._0_8_;
  local_3a0._0_16_ = local_100;
  local_3a0._24_8_ = auStack_f0._8_8_;
  local_246 = 1;
  local_82 = 1;
  local_84 = 1;
  local_86 = 1;
  local_88 = 1;
  local_8a = 1;
  local_8c = 1;
  local_8e = 1;
  local_90 = 1;
  local_92 = 1;
  local_94 = 1;
  local_96 = 1;
  local_98 = 1;
  local_9a = 1;
  local_9c = 1;
  local_9e = 1;
  local_a0 = 1;
  auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar2 = vpinsrw_avx(auVar2,1,2);
  auVar2 = vpinsrw_avx(auVar2,1,3);
  auVar2 = vpinsrw_avx(auVar2,1,4);
  auVar2 = vpinsrw_avx(auVar2,1,5);
  auVar2 = vpinsrw_avx(auVar2,1,6);
  auVar2 = vpinsrw_avx(auVar2,1,7);
  auVar3 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar3 = vpinsrw_avx(auVar3,1,2);
  auVar3 = vpinsrw_avx(auVar3,1,3);
  auVar3 = vpinsrw_avx(auVar3,1,4);
  auVar3 = vpinsrw_avx(auVar3,1,5);
  auVar3 = vpinsrw_avx(auVar3,1,6);
  auVar3 = vpinsrw_avx(auVar3,1,7);
  auVar4._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar4._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar5 = auVar4;
  auVar2 = local_410;
  local_120 = local_242;
  local_11e = local_242;
  local_11c = local_242;
  local_11a = local_242;
  local_118 = local_242;
  local_116 = local_242;
  local_114 = local_242;
  local_112 = local_242;
  local_110 = local_242;
  local_10e = local_242;
  local_10c = local_242;
  local_10a = local_242;
  local_108 = local_242;
  local_106 = local_242;
  local_104 = local_242;
  local_102 = local_242;
  local_c0 = auVar4;
  for (local_3c4 = 0; local_410 = auVar2, uStack_3b0 = auVar4._16_8_, uStack_3a8 = auVar4._24_8_,
      local_3c4 < 0x10; local_3c4 = local_3c4 + 1) {
    local_1e0 = local_320._0_8_;
    uStack_1d8 = local_320._8_8_;
    uStack_1d0 = local_320._16_8_;
    uStack_1c8 = local_320._24_8_;
    local_200 = local_3a0._0_8_;
    uStack_1f8 = local_3a0._8_8_;
    uStack_1f0 = local_3a0._16_8_;
    uStack_1e8 = local_3a0._24_8_;
    auVar5 = vpshufb_avx2(local_320,local_3a0);
    auVar2 = auVar5._0_16_;
    paeth_16x1_pred(left_00,in_stack_fffffffffffffbe0._8_8_,in_stack_fffffffffffffbe0._0_8_);
    in_RSI = local_360;
    left_00 = auVar2._0_8_;
    top = in_stack_fffffffffffffbe0._8_8_;
    topleft = in_stack_fffffffffffffbe0._0_8_;
    in_stack_fffffffffffffbe0 = auVar2;
    paeth_16x1_pred(left_00,top,topleft);
    local_148 = local_2e8;
    uStack_408 = auVar2._8_8_;
    uStack_158 = uStack_408;
    *(__m256i **)local_2e8 = left_00;
    *(undefined8 *)(local_2e8 + 8) = uStack_408;
    local_168 = local_2e8 + 0x10;
    local_180 = in_stack_fffffffffffffbe0._0_8_;
    uStack_178 = in_stack_fffffffffffffbe0._8_8_;
    *(undefined8 *)local_168 = local_180;
    *(undefined8 *)(local_2e8 + 0x18) = uStack_178;
    local_2e8 = local_2f0 + (long)local_2e8;
    local_280 = local_3a0._0_8_;
    uStack_278 = local_3a0._8_8_;
    uStack_270 = local_3a0._16_8_;
    uStack_268 = local_3a0._24_8_;
    uStack_290 = uStack_3b0;
    uStack_288 = uStack_3a8;
    auVar1._16_8_ = uStack_3b0;
    auVar1._0_16_ = auVar4._0_16_;
    auVar1._24_8_ = uStack_3a8;
    auVar5 = vpaddw_avx2(local_3a0,auVar1);
    local_3a0 = auVar5;
    local_160 = left_00;
    local_2a0 = auVar4._0_16_;
  }
  get_left_vector((__m256i *)(*local_300 + 2),in_RSI);
  local_248 = 0x8000;
  local_32 = 0x8000;
  local_34 = 0x8000;
  local_36 = 0x8000;
  local_38 = 0x8000;
  local_3a = 0x8000;
  local_3c = 0x8000;
  local_3e = 0x8000;
  local_40 = 0x8000;
  local_42 = 0x8000;
  local_44 = 0x8000;
  local_46 = 0x8000;
  local_48 = 0x8000;
  local_4a = 0x8000;
  local_4c = 0x8000;
  local_4e = 0x8000;
  local_50 = 0x8000;
  auVar2 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
  auVar2 = vpinsrw_avx(auVar2,0x8000,2);
  auVar2 = vpinsrw_avx(auVar2,0x8000,3);
  auVar2 = vpinsrw_avx(auVar2,0x8000,4);
  auVar2 = vpinsrw_avx(auVar2,0x8000,5);
  auVar2 = vpinsrw_avx(auVar2,0x8000,6);
  auVar2 = vpinsrw_avx(auVar2,0x8000,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
  auVar3 = vpinsrw_avx(auVar3,0x8000,2);
  auVar3 = vpinsrw_avx(auVar3,0x8000,3);
  auVar3 = vpinsrw_avx(auVar3,0x8000,4);
  auVar3 = vpinsrw_avx(auVar3,0x8000,5);
  auVar3 = vpinsrw_avx(auVar3,0x8000,6);
  auVar3 = vpinsrw_avx(auVar3,0x8000,7);
  auVar6._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar6._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  local_80._16_8_ = auVar6._16_8_;
  local_80._24_8_ = auVar6._24_8_;
  local_3a0._16_8_ = local_80._16_8_;
  local_3a0._0_16_ = auVar6._0_16_;
  local_3a0._24_8_ = local_80._24_8_;
  local_320 = auVar5;
  local_80 = auVar6;
  for (local_3c4 = 0; local_3c4 < 0x10; local_3c4 = local_3c4 + 1) {
    local_220 = local_320._0_8_;
    uStack_218 = local_320._8_8_;
    uStack_210 = local_320._16_8_;
    uStack_208 = local_320._24_8_;
    local_240 = local_3a0._0_8_;
    uStack_238 = local_3a0._8_8_;
    uStack_230 = local_3a0._16_8_;
    uStack_228 = local_3a0._24_8_;
    auVar5 = vpshufb_avx2(local_320,local_3a0);
    auVar3 = auVar5._0_16_;
    paeth_16x1_pred(left_00,in_stack_fffffffffffffbe0._8_8_,in_stack_fffffffffffffbe0._0_8_);
    auVar2 = auVar3;
    paeth_16x1_pred(left_00,in_stack_fffffffffffffbe0._8_8_,in_stack_fffffffffffffbe0._0_8_);
    local_188 = local_2e8;
    local_450 = auVar3._0_8_;
    local_1a0 = local_450;
    uStackY_448 = auVar3._8_8_;
    uStack_198 = uStackY_448;
    *(undefined8 *)local_2e8 = local_450;
    *(undefined8 *)(local_2e8 + 8) = uStackY_448;
    local_1a8 = local_2e8 + 0x10;
    local_460 = auVar2._0_8_;
    local_1c0 = local_460;
    uStackY_458 = auVar2._8_8_;
    uStack_1b8 = uStackY_458;
    *(undefined8 *)local_1a8 = local_460;
    *(undefined8 *)(local_2e8 + 0x18) = uStackY_458;
    local_2e8 = local_2f0 + (long)local_2e8;
    local_2c0 = local_3a0._0_8_;
    uStack_2b8 = local_3a0._8_8_;
    uStack_2b0 = local_3a0._16_8_;
    uStack_2a8 = local_3a0._24_8_;
    uStack_2d0 = uStack_3b0;
    uStack_2c8 = uStack_3a8;
    auVar5._16_8_ = uStack_3b0;
    auVar5._0_16_ = auVar4._0_16_;
    auVar5._24_8_ = uStack_3a8;
    local_3a0 = vpaddw_avx2(local_3a0,auVar5);
    local_2e0 = auVar4._0_16_;
  }
  return;
}

Assistant:

void aom_paeth_predictor_32x32_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  __m256i l = get_left_vector(left);
  const __m256i t0 = get_top_vector(above);
  const __m256i t1 = get_top_vector(above + 16);
  const __m256i tl = _mm256_set1_epi16((int16_t)above[-1]);
  __m256i rep = _mm256_set1_epi16((short)0x8000);
  const __m256i one = _mm256_set1_epi16(1);

  int i;
  for (i = 0; i < 16; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);

    const __m128i r0 = paeth_16x1_pred(&l16, &t0, &tl);
    const __m128i r1 = paeth_16x1_pred(&l16, &t1, &tl);

    _mm_store_si128((__m128i *)dst, r0);
    _mm_store_si128((__m128i *)(dst + 16), r1);

    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }

  l = get_left_vector(left + 16);
  rep = _mm256_set1_epi16((short)0x8000);
  for (i = 0; i < 16; ++i) {
    const __m256i l16 = _mm256_shuffle_epi8(l, rep);

    const __m128i r0 = paeth_16x1_pred(&l16, &t0, &tl);
    const __m128i r1 = paeth_16x1_pred(&l16, &t1, &tl);

    _mm_store_si128((__m128i *)dst, r0);
    _mm_store_si128((__m128i *)(dst + 16), r1);

    dst += stride;
    rep = _mm256_add_epi16(rep, one);
  }
}